

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
google::protobuf::internal::MethodClosure0<google::protobuf::(anonymous_namespace)::ClosureTest>::
Run(MethodClosure0<google::protobuf::(anonymous_namespace)::ClosureTest> *this)

{
  bool bVar1;
  code *pcVar2;
  
  bVar1 = this->self_deleting_;
  pcVar2 = (code *)this->method_;
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *(long *)((long)&(this->object_->super_Test)._vptr_Test +
                                          *(long *)&this->field_0x18) + -1);
  }
  (*pcVar2)();
  if (bVar1 != false) {
    (*(this->super_Closure)._vptr_Closure[1])(this);
    return;
  }
  return;
}

Assistant:

void Run() override {
    bool needs_delete = self_deleting_;  // read in case callback deletes
    (object_->*method_)();
    if (needs_delete) delete this;
  }